

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

void lyd_free_withsiblings_r(lyd_node *first)

{
  lyd_node *plVar1;
  
  while (first != (lyd_node *)0x0) {
    plVar1 = first->next;
    if ((first->schema->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) !=
        LYS_UNKNOWN) {
      lyd_free_withsiblings_r(first->child);
    }
    _lyd_free_node(first);
    first = plVar1;
  }
  return;
}

Assistant:

static void
lyd_free_withsiblings_r(struct lyd_node *first)
{
    struct lyd_node *next, *node;

    LY_TREE_FOR_SAFE(first, next, node) {
        if (node->schema->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_RPC | LYS_ACTION | LYS_NOTIF)) {
            lyd_free_withsiblings_r(node->child);
        }
        _lyd_free_node(node);
    }
}